

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyId Js::JavascriptProxy::EnsureHandlerPropertyId(ScriptContext *scriptContext)

{
  char16_t *string;
  PropertyId PVar1;
  LPCWSTR pWVar2;
  size_t sVar3;
  PropertyRecord *this;
  CharacterBuffer<char16_t> local_30;
  char16_t *local_20;
  LPCWSTR autoProxyName;
  ThreadContext *threadContext;
  ScriptContext *scriptContext_local;
  
  threadContext = (ThreadContext *)scriptContext;
  autoProxyName = (LPCWSTR)ScriptContext::GetThreadContext(scriptContext);
  if (((ThreadContext *)autoProxyName)->handlerPropertyId == -1) {
    pWVar2 = ThreadContext::GetAutoProxyName((ThreadContext *)autoProxyName);
    if (pWVar2 == (LPCWSTR)0x0) {
      local_20 = String::operator_cast_to_char16_t_((String *)&DAT_01eca2b0);
    }
    else {
      local_20 = ThreadContext::GetAutoProxyName((ThreadContext *)autoProxyName);
    }
    pWVar2 = autoProxyName;
    string = local_20;
    sVar3 = PAL_wcslen(local_20);
    JsUtil::CharacterBuffer<char16_t>::CharacterBuffer(&local_30,string,(charcount_t)sVar3);
    this = ThreadContext::GetOrAddPropertyRecordBind((ThreadContext *)pWVar2,&local_30);
    PVar1 = PropertyRecord::GetPropertyId(this);
    *(PropertyId *)(autoProxyName + 0xb50) = PVar1;
  }
  return *(PropertyId *)(autoProxyName + 0xb50);
}

Assistant:

PropertyId JavascriptProxy::EnsureHandlerPropertyId(ScriptContext* scriptContext)
    {
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        if (threadContext->handlerPropertyId == Js::Constants::NoProperty)
        {
            LPCWSTR autoProxyName;

            if (threadContext->GetAutoProxyName() != nullptr)
            {
                autoProxyName = threadContext->GetAutoProxyName();
            }
            else
            {
                autoProxyName = Js::Configuration::Global.flags.autoProxy;
            }

            threadContext->handlerPropertyId = threadContext->GetOrAddPropertyRecordBind(
                JsUtil::CharacterBuffer<WCHAR>(autoProxyName, static_cast<charcount_t>(wcslen(autoProxyName))))->GetPropertyId();
        }
        return threadContext->handlerPropertyId;
    }